

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadGeometry(OgreXmlSerializer *this,VertexDataXml *dest)

{
  bool bVar1;
  uint32_t uVar2;
  Logger *this_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *this_01;
  basic_formatter *this_02;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_38;
  VertexDataXml *local_18;
  VertexDataXml *dest_local;
  OgreXmlSerializer *this_local;
  
  local_18 = dest;
  dest_local = (VertexDataXml *)this;
  uVar2 = ReadAttribute<unsigned_int>(this,"vertexcount");
  (local_18->super_IVertexData).count = uVar2;
  this_00 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[25]>(&local_1b0,(char (*) [25])"  - Reading geometry of ");
  this_01 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       &local_1b0,(uint *)local_18);
  this_02 = (basic_formatter *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      (this_01,(char (*) [10])0xbbdaca);
  Formatter::basic_formatter::operator_cast_to_string(&local_38,this_02);
  Logger::debug(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_formatter
            (&local_1b0);
  NextNode_abi_cxx11_(this);
  while( true ) {
    bVar1 = std::operator==(&this->m_currentNodeName,nnVertexBuffer);
    if (!bVar1) break;
    ReadGeometryVertexBuffer(this,local_18);
  }
  return;
}

Assistant:

void OgreXmlSerializer::ReadGeometry(VertexDataXml *dest)
{
    dest->count = ReadAttribute<uint32_t>("vertexcount");
    ASSIMP_LOG_DEBUG_F( "  - Reading geometry of ", dest->count, " vertices");

    NextNode();
    while(m_currentNodeName == nnVertexBuffer) {
        ReadGeometryVertexBuffer(dest);
    }
}